

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O1

MXF * __thiscall ASDCP::MXF::SeekToRIP(MXF *this,IFileReader *Reader)

{
  uint uVar1;
  ILogSink *pIVar2;
  undefined1 *this_00;
  fpos_t end_pos;
  byte_t intbuf [4];
  ui32_t read_count;
  Result_t result;
  long local_f8;
  uint local_f0;
  int local_ec;
  Result_t local_e8 [104];
  int local_80 [26];
  
  this_00 = (undefined1 *)local_80;
  (**(code **)(*(long *)Reader + 0x28))(this_00,Reader,0,2);
  if (-1 < local_80[0]) {
    (**(code **)(*(long *)Reader + 0x30))(local_e8,Reader,&local_f8);
    Kumu::Result_t::operator=((Result_t *)local_80,local_e8);
    Kumu::Result_t::~Result_t(local_e8);
  }
  if ((-1 < local_80[0]) && (local_f8 < 0x14)) {
    pIVar2 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar2,"File is smaller than an empty KLV packet.\n");
    Kumu::Result_t::operator=((Result_t *)local_80,(Result_t *)Kumu::RESULT_FAIL);
  }
  if (-1 < local_80[0]) {
    (**(code **)(*(long *)Reader + 0x28))(local_e8,Reader,local_f8 + -4,0);
    Kumu::Result_t::operator=((Result_t *)local_80,local_e8);
    Kumu::Result_t::~Result_t(local_e8);
  }
  if (-1 < local_80[0]) {
    (**(code **)(*(long *)Reader + 0x38))(local_e8,Reader,&local_f0,4,&local_ec);
    Kumu::Result_t::operator=((Result_t *)local_80,local_e8);
    Kumu::Result_t::~Result_t(local_e8);
    if ((-1 < local_80[0]) && (local_ec != 4)) {
      pIVar2 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar2,"RIP contains fewer than four bytes.\n");
      Kumu::Result_t::operator=((Result_t *)local_80,(Result_t *)Kumu::RESULT_FAIL);
    }
  }
  if (local_80[0] < 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = local_f0 >> 0x18 | (local_f0 & 0xff0000) >> 8 | (local_f0 & 0xff00) << 8 |
            local_f0 << 0x18;
    if (local_f8 < (long)(ulong)uVar1) {
      pIVar2 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar2,"RIP size impossibly large.\n");
      this_00 = Kumu::RESULT_FAIL;
      goto LAB_001a4bfc;
    }
  }
  if (-1 < local_80[0]) {
    (**(code **)(*(long *)Reader + 0x28))(local_e8,Reader,local_f8 - (ulong)uVar1,0);
    this_00 = (undefined1 *)local_80;
    Kumu::Result_t::operator=((Result_t *)this_00,local_e8);
    Kumu::Result_t::~Result_t(local_e8);
  }
LAB_001a4bfc:
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)this_00);
  Kumu::Result_t::~Result_t((Result_t *)local_80);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::SeekToRIP(const Kumu::IFileReader& Reader)
{
  Kumu::fpos_t end_pos;

  // go to the end - 4 bytes
  Result_t result = Reader.Seek(0, Kumu::SP_END);

  if ( ASDCP_SUCCESS(result) )
    result = Reader.Tell(&end_pos);

  if ( ASDCP_SUCCESS(result)
       && end_pos < (SMPTE_UL_LENGTH+MXF_BER_LENGTH) )
    {
      DefaultLogSink().Error("File is smaller than an empty KLV packet.\n");
      result = RESULT_FAIL;
    }

  if ( ASDCP_SUCCESS(result) )
    result = Reader.Seek(end_pos - 4);

  // get the ui32_t RIP length
  ui32_t read_count;
  byte_t intbuf[MXF_BER_LENGTH];
  ui32_t rip_size = 0;

  if ( ASDCP_SUCCESS(result) )
    {
      result = Reader.Read(intbuf, MXF_BER_LENGTH, &read_count);

      if ( ASDCP_SUCCESS(result) && read_count != 4 )
	{
	  DefaultLogSink().Error("RIP contains fewer than four bytes.\n");
	  result = RESULT_FAIL;
	}
    }

  if ( ASDCP_SUCCESS(result) )
    {
      rip_size = KM_i32_BE(Kumu::cp2i<ui32_t>(intbuf));

      if ( rip_size > end_pos ) // RIP can't be bigger than the file
	{
	  DefaultLogSink().Error("RIP size impossibly large.\n");
	  return RESULT_FAIL;
	}
    }

  // reposition to start of RIP
  if ( ASDCP_SUCCESS(result) )
    result = Reader.Seek(end_pos - rip_size);

  return result;
}